

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDch(Abc_Ntk_t *pNtk,Dch_Pars_t *pPars)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  abctime aVar3;
  abctime aVar4;
  abctime clk;
  Gia_Man_t *pGia;
  Abc_Ntk_t *pNtkAig;
  Aig_Man_t *pTemp;
  Aig_Man_t *pMan;
  Dch_Pars_t *pPars_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    pAVar2 = Abc_NtkToDar(pNtk,0,0);
    if (pAVar2 == (Aig_Man_t *)0x0) {
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    else {
      aVar3 = Abc_Clock();
      if (pPars->fSynthesis == 0) {
        clk = (abctime)Gia_ManFromAig(pAVar2);
        Aig_ManStop(pAVar2);
      }
      else {
        clk = (abctime)Dar_NewChoiceSynthesis
                                 (pAVar2,1,1,pPars->fPower,pPars->fLightSynth,pPars->fVerbose);
      }
      aVar4 = Abc_Clock();
      pPars->timeSynth = aVar4 - aVar3;
      if (pPars->fUseGia == 0) {
        pAVar2 = Gia_ManToAigSkip((Gia_Man_t *)clk,3);
        Gia_ManStop((Gia_Man_t *)clk);
        pTemp = Dch_ComputeChoices(pAVar2,pPars);
        Aig_ManStop(pAVar2);
      }
      else {
        pTemp = Cec_ComputeChoices((Gia_Man_t *)clk,pPars);
      }
      pNtk_local = Abc_NtkFromDarChoices(pNtk,pTemp);
      Aig_ManStop(pTemp);
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                ,0x67c,"Abc_Ntk_t *Abc_NtkDch(Abc_Ntk_t *, Dch_Pars_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDch( Abc_Ntk_t * pNtk, Dch_Pars_t * pPars )
{
    extern Gia_Man_t * Dar_NewChoiceSynthesis( Aig_Man_t * pAig, int fBalance, int fUpdateLevel, int fPower, int fLightSynth, int fVerbose );
    extern Aig_Man_t * Cec_ComputeChoices( Gia_Man_t * pGia, Dch_Pars_t * pPars );

    Aig_Man_t * pMan, * pTemp;
    Abc_Ntk_t * pNtkAig;
    Gia_Man_t * pGia;
    abctime clk;
    assert( Abc_NtkIsStrash(pNtk) );
    pMan = Abc_NtkToDar( pNtk, 0, 0 );
    if ( pMan == NULL )
        return NULL;
clk = Abc_Clock();
    if ( pPars->fSynthesis )
        pGia = Dar_NewChoiceSynthesis( pMan, 1, 1, pPars->fPower, pPars->fLightSynth, pPars->fVerbose );
    else
    {
        pGia = Gia_ManFromAig( pMan );
        Aig_ManStop( pMan );
    }
pPars->timeSynth = Abc_Clock() - clk;
    if ( pPars->fUseGia )
        pMan = Cec_ComputeChoices( pGia, pPars );
    else
    {
        pMan = Gia_ManToAigSkip( pGia, 3 );
        Gia_ManStop( pGia );
        pMan = Dch_ComputeChoices( pTemp = pMan, pPars );
        Aig_ManStop( pTemp );
    }
    pNtkAig = Abc_NtkFromDarChoices( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}